

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O0

bool __thiscall QGraphicsViewPrivate::updateRect(QGraphicsViewPrivate *this,QRect *r)

{
  int iVar1;
  bool bVar2;
  QRect *rect;
  QRect *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  int in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  QRect *in_stack_ffffffffffffff98;
  bool local_29;
  undefined1 local_28 [16];
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (((*(uint *)(in_RDI + 0x300) >> 0xc & 1) == 0) && (*(int *)(in_RDI + 0x484) != 3)) {
    QWidget::width((QWidget *)0xa3663a);
    QWidget::height((QWidget *)0xa36651);
    bVar2 = intersectsViewport((QRect *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80
                                                ),in_stack_ffffffffffffff7c,
                               in_stack_ffffffffffffff78);
    if (bVar2) {
      iVar1 = *(int *)(in_RDI + 0x484);
      if (iVar1 == 0) {
        *(uint *)(in_RDI + 0x300) = *(uint *)(in_RDI + 0x300) & 0xffffefff | 0x1000;
        QWidget::update((QWidget *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      }
      else if (iVar1 - 1U < 2) {
        if ((*(uint *)(in_RDI + 0x300) >> 0xd & 1) == 0) {
          QRegion::operator+=((QRegion *)(in_RDI + 0x528),(QRect *)in_RSI);
        }
        else {
          local_28 = QRect::operator&(in_RSI,(QRect *)(in_RDI + 0x328));
          QRegion::operator+=((QRegion *)(in_RDI + 0x528),(QRect *)local_28);
        }
      }
      else if (iVar1 == 4) {
        if ((*(uint *)(in_RDI + 0x300) >> 0xd & 1) == 0) {
          QRect_unite(in_stack_ffffffffffffff98,
                      (QRect *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
        }
        else {
          rect = (QRect *)(in_RDI + 0x530);
          local_18 = QRect::operator&(in_RSI,(QRect *)(in_RDI + 0x328));
          QRect_unite(rect,(QRect *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
        }
        QWidget::width((QWidget *)0xa3675c);
        QWidget::height((QWidget *)0xa36773);
        bVar2 = containsViewport((QRect *)CONCAT17(in_stack_ffffffffffffff87,
                                                   in_stack_ffffffffffffff80),
                                 in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78);
        if (bVar2) {
          *(uint *)(in_RDI + 0x300) = *(uint *)(in_RDI + 0x300) & 0xffffefff | 0x1000;
          QWidget::update((QWidget *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
        }
      }
      local_29 = true;
      goto LAB_00a36821;
    }
  }
  local_29 = false;
LAB_00a36821:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_29;
}

Assistant:

bool QGraphicsViewPrivate::updateRect(const QRect &r)
{
    if (fullUpdatePending || viewportUpdateMode == QGraphicsView::NoViewportUpdate
        || !intersectsViewport(r, viewport->width(), viewport->height())) {
        return false;
    }

    switch (viewportUpdateMode) {
    case QGraphicsView::FullViewportUpdate:
        fullUpdatePending = true;
        viewport->update();
        break;
    case QGraphicsView::BoundingRectViewportUpdate:
        if (hasUpdateClip)
            QRect_unite(&dirtyBoundingRect, r & updateClip);
        else
            QRect_unite(&dirtyBoundingRect, r);
        if (containsViewport(dirtyBoundingRect, viewport->width(), viewport->height())) {
            fullUpdatePending = true;
            viewport->update();
        }
        break;
    case QGraphicsView::SmartViewportUpdate: // ### DEPRECATE
    case QGraphicsView::MinimalViewportUpdate:
        if (hasUpdateClip)
            dirtyRegion += r & updateClip;
        else
            dirtyRegion += r;
        break;
    default:
        break;
    }

    return true;
}